

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

void h1_tunnel_go_state(Curl_cfilter *cf,h1_tunnel_state_conflict *ts,h1_tunnel_state new_state,
                       Curl_easy *data)

{
  Curl_easy *data_local;
  h1_tunnel_state new_state_local;
  h1_tunnel_state_conflict *ts_local;
  Curl_cfilter *cf_local;
  
  if (ts->tunnel_state != new_state) {
    switch(new_state) {
    case H1_TUNNEL_INIT:
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          && (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"new tunnel state \'init\'");
      }
      tunnel_reinit(cf,data,ts);
      break;
    case H1_TUNNEL_CONNECT:
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"new tunnel state \'connect\'");
      }
      ts->tunnel_state = H1_TUNNEL_CONNECT;
      ts->keepon = KEEPON_CONNECT;
      Curl_dyn_reset(&ts->rcvbuf);
      break;
    case H1_TUNNEL_RECEIVE:
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"new tunnel state \'receive\'");
      }
      ts->tunnel_state = H1_TUNNEL_RECEIVE;
      break;
    case H1_TUNNEL_RESPONSE:
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          && (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"new tunnel state \'response\'");
      }
      ts->tunnel_state = H1_TUNNEL_RESPONSE;
      break;
    case H1_TUNNEL_ESTABLISHED:
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          && (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"new tunnel state \'established\'");
      }
      if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
        Curl_infof(data,"CONNECT phase completed");
      }
      (data->state).authproxy.field_0x18 = (data->state).authproxy.field_0x18 & 0xfe | 1;
      (data->state).authproxy.field_0x18 = (data->state).authproxy.field_0x18 & 0xfd;
    case H1_TUNNEL_FAILED:
      if (((new_state == H1_TUNNEL_FAILED) && (data != (Curl_easy *)0x0)) &&
         (((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0 &&
          ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))))) {
        Curl_trc_cf_infof(data,cf,"new tunnel state \'failed\'");
      }
      ts->tunnel_state = new_state;
      Curl_dyn_reset(&ts->rcvbuf);
      Curl_dyn_reset(&ts->request_data);
      (data->info).httpcode = 0;
      (*Curl_cfree)((data->state).aptr.proxyuserpwd);
      (data->state).aptr.proxyuserpwd = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void h1_tunnel_go_state(struct Curl_cfilter *cf,
                               struct h1_tunnel_state *ts,
                               h1_tunnel_state new_state,
                               struct Curl_easy *data)
{
  if(ts->tunnel_state == new_state)
    return;
  /* entering this one */
  switch(new_state) {
  case H1_TUNNEL_INIT:
    CURL_TRC_CF(data, cf, "new tunnel state 'init'");
    tunnel_reinit(cf, data, ts);
    break;

  case H1_TUNNEL_CONNECT:
    CURL_TRC_CF(data, cf, "new tunnel state 'connect'");
    ts->tunnel_state = H1_TUNNEL_CONNECT;
    ts->keepon = KEEPON_CONNECT;
    Curl_dyn_reset(&ts->rcvbuf);
    break;

  case H1_TUNNEL_RECEIVE:
    CURL_TRC_CF(data, cf, "new tunnel state 'receive'");
    ts->tunnel_state = H1_TUNNEL_RECEIVE;
    break;

  case H1_TUNNEL_RESPONSE:
    CURL_TRC_CF(data, cf, "new tunnel state 'response'");
    ts->tunnel_state = H1_TUNNEL_RESPONSE;
    break;

  case H1_TUNNEL_ESTABLISHED:
    CURL_TRC_CF(data, cf, "new tunnel state 'established'");
    infof(data, "CONNECT phase completed");
    data->state.authproxy.done = TRUE;
    data->state.authproxy.multipass = FALSE;
    FALLTHROUGH();
  case H1_TUNNEL_FAILED:
    if(new_state == H1_TUNNEL_FAILED)
      CURL_TRC_CF(data, cf, "new tunnel state 'failed'");
    ts->tunnel_state = new_state;
    Curl_dyn_reset(&ts->rcvbuf);
    Curl_dyn_reset(&ts->request_data);
    /* restore the protocol pointer */
    data->info.httpcode = 0; /* clear it as it might've been used for the
                                proxy */
    /* If a proxy-authorization header was used for the proxy, then we should
       make sure that it isn't accidentally used for the document request
       after we've connected. So let's free and clear it here. */
    Curl_safefree(data->state.aptr.proxyuserpwd);
#ifdef USE_HYPER
    data->state.hconnect = FALSE;
#endif
    break;
  }
}